

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_multi_statemach(Curl_easy *data,_Bool *done)

{
  connectdata *pcVar1;
  CURLcode CVar2;
  
  pcVar1 = data->conn;
  CVar2 = Curl_pp_statemach(data,&(pcVar1->proto).ftpc.pp,false,false);
  *done = (pcVar1->proto).ftpc.state == '\0';
  return CVar2;
}

Assistant:

static CURLcode ftp_multi_statemach(struct Curl_easy *data,
                                    bool *done)
{
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result = Curl_pp_statemach(data, &ftpc->pp, FALSE, FALSE);

  /* Check for the state outside of the Curl_socket_check() return code checks
     since at times we are in fact already in this state when this function
     gets called. */
  *done = (ftpc->state == FTP_STOP) ? TRUE : FALSE;

  return result;
}